

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Chooser2.cxx
# Opt level: O2

int __thiscall Fl_File_Chooser::count(Fl_File_Chooser *this)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int line;
  
  pcVar1 = (this->fileName->super_Fl_Input).super_Fl_Input_.value_;
  if ((this->type_ & 1) != 0) {
    iVar3 = 0;
    for (line = 1; line <= (this->fileList->super_Fl_Browser).lines; line = line + 1) {
      iVar2 = Fl_Browser::selected(&this->fileList->super_Fl_Browser,line);
      iVar3 = (iVar3 + 1) - (uint)(iVar2 == 0);
    }
    if (iVar3 != 0) {
      return iVar3;
    }
  }
  uVar4 = 0;
  if (pcVar1 != (char *)0x0) {
    uVar4 = (uint)(*pcVar1 != '\0');
  }
  return uVar4;
}

Assistant:

int				// O - Number of selected files
Fl_File_Chooser::count() {
  int		i;		// Looping var
  int		fcount;		// Number of selected files
  const char	*filename;	// Filename in input field or list


  filename = fileName->value();

  if (!(type_ & MULTI)) {
    // Check to see if the file name input field is blank...
    if (!filename || !filename[0]) return 0;
    else return 1;
  }

  for (i = 1, fcount = 0; i <= fileList->size(); i ++)
    if (fileList->selected(i)) {
      // See if this file is a directory...
      // matt: why would we do that? It is perfectly legal to select multiple
      // directories in a DIR chooser. They are visually selected and value(i)
      // returns all of them as expected
      //filename = (char *)fileList->text(i);

      //if (filename[strlen(filename) - 1] != '/')
	fcount ++;
    }

  if (fcount) return fcount;
  else if (!filename || !filename[0]) return 0;
  else return 1;
}